

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# controller.cpp
# Opt level: O1

void __thiscall Controller::tooggleFlag(Controller *this,int given_x,int given_y)

{
  bool bVar1;
  
  bVar1 = Minefield::isPosValid(&this->mfield,given_x,given_y);
  if (bVar1) {
    bVar1 = Minefield::isGameRunning(&this->mfield);
    if (bVar1) {
      bVar1 = Minefield::isOpen(&this->mfield,given_x,given_y);
      if (!bVar1) {
        bVar1 = Minefield::isFlagged(&this->mfield,given_x,given_y);
        if (bVar1) {
          Minefield::unflag(&this->mfield,given_x,given_y);
          return;
        }
        Minefield::flag(&this->mfield,given_x,given_y);
        return;
      }
    }
  }
  return;
}

Assistant:

void Controller::tooggleFlag(int given_x, int given_y) {
    // check pos
    if (mfield.isPosValid(given_x, given_y)) {
        // only do stuff while game is running
        if (mfield.isGameRunning()) {
            // don't do anything on already open fields
            if (! mfield.isOpen(given_x, given_y)) {
                // no choose: flag or unflag
                if (mfield.isFlagged(given_x, given_y)) {
                    mfield.unflag(given_x, given_y);
                } else {
                    mfield.flag(given_x, given_y);
                }
            }
        }
    }
}